

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
try_dequeue<loop::MessageLoop::TaskInfo*>
          (ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>
           *this,TaskInfo **item)

{
  bool bVar1;
  __pointer_type pPVar2;
  ProducerBase *local_50;
  __pointer_type ptr_1;
  size_t size;
  __pointer_type ptr;
  size_t bestSize;
  ProducerBase *best;
  size_t nonEmptyCount;
  TaskInfo **item_local;
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
  *this_local;
  
  best = (ProducerBase *)0x0;
  bestSize = 0;
  ptr = (__pointer_type)0x0;
  for (size = (size_t)std::
                      atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                      ::load((atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                              *)this,memory_order_acquire); best < (ProducerBase *)0x3 && size != 0;
      size = (size_t)ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
                     ::ProducerBase::next_prod((ProducerBase *)size)) {
    pPVar2 = (__pointer_type)
             ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
             ::ProducerBase::size_approx((ProducerBase *)size);
    if (pPVar2 != (__pointer_type)0x0) {
      if (ptr < pPVar2) {
        bestSize = size;
        ptr = pPVar2;
      }
      best = (ProducerBase *)((long)&best->_vptr_ProducerBase + 1);
    }
  }
  if (best != (ProducerBase *)0x0) {
    bVar1 = ProducerBase::dequeue<loop::MessageLoop::TaskInfo*>((ProducerBase *)bestSize,item);
    bVar1 = details::likely(bVar1);
    if (bVar1) {
      return true;
    }
    for (local_50 = std::
                    atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                    ::load((atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                            *)this,memory_order_acquire); local_50 != (ProducerBase *)0x0;
        local_50 = ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
                   ::ProducerBase::next_prod(local_50)) {
      if ((local_50 != (ProducerBase *)bestSize) &&
         (bVar1 = ProducerBase::dequeue<loop::MessageLoop::TaskInfo*>((ProducerBase *)local_50,item)
         , bVar1)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool try_dequeue(U& item)
	{
		// Instead of simply trying each producer in turn (which could cause needless contention on the first
		// producer), we score them heuristically.
		size_t nonEmptyCount = 0;
		ProducerBase* best = nullptr;
		size_t bestSize = 0;
		for (auto ptr = producerListTail.load(std::memory_order_acquire); nonEmptyCount < 3 && ptr != nullptr; ptr = ptr->next_prod()) {
			auto size = ptr->size_approx();
			if (size > 0) {
				if (size > bestSize) {
					bestSize = size;
					best = ptr;
				}
				++nonEmptyCount;
			}
		}
		
		// If there was at least one non-empty queue but it appears empty at the time
		// we try to dequeue from it, we need to make sure every queue's been tried
		if (nonEmptyCount > 0) {
			if (details::likely(best->dequeue(item))) {
				return true;
			}
			for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
				if (ptr != best && ptr->dequeue(item)) {
					return true;
				}
			}
		}
		return false;
	}